

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int inputPush(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  xmlParserInputPtr *ppxVar1;
  xmlParserInputPtr value_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (value == (xmlParserInputPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->inputMax <= ctxt->inputNr) {
      ctxt->inputMax = ctxt->inputMax << 1;
      ppxVar1 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(long)ctxt->inputMax << 3);
      ctxt->inputTab = ppxVar1;
      if (ctxt->inputTab == (xmlParserInputPtr *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        ctxt->inputMax = ctxt->inputMax / 2;
        return -1;
      }
    }
    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;
    ctxt_local._4_4_ = ctxt->inputNr;
    ctxt->inputNr = ctxt_local._4_4_ + 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
inputPush(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    if ((ctxt == NULL) || (value == NULL))
        return(-1);
    if (ctxt->inputNr >= ctxt->inputMax) {
        ctxt->inputMax *= 2;
        ctxt->inputTab =
            (xmlParserInputPtr *) xmlRealloc(ctxt->inputTab,
                                             ctxt->inputMax *
                                             sizeof(ctxt->inputTab[0]));
        if (ctxt->inputTab == NULL) {
            xmlErrMemory(ctxt, NULL);
	    ctxt->inputMax /= 2;
            return (-1);
        }
    }
    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;
    return (ctxt->inputNr++);
}